

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O3

char * u_getTimeZoneFilesDirectory_63(UErrorCode *status)

{
  UBool UVar1;
  char *pcVar2;
  
  pcVar2 = "";
  if (U_ZERO_ERROR < *status) {
    return "";
  }
  if ((gTimeZoneFilesInitOnce_63.fState.super___atomic_base<int>._M_i == 2) ||
     (UVar1 = icu_63::umtx_initImplPreInit(&gTimeZoneFilesInitOnce_63), UVar1 == '\0')) {
    if (U_ZERO_ERROR < gTimeZoneFilesInitOnce_63.fErrCode) {
      *status = gTimeZoneFilesInitOnce_63.fErrCode;
      return "";
    }
  }
  else {
    TimeZoneDataDirInitFn(status);
    gTimeZoneFilesInitOnce_63.fErrCode = *status;
    icu_63::umtx_initImplPostInit(&gTimeZoneFilesInitOnce_63);
  }
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pcVar2 = (gTimeZoneFilesDirectory->buffer).ptr;
  }
  return pcVar2;
}

Assistant:

U_CAPI const char * U_EXPORT2
u_getTimeZoneFilesDirectory(UErrorCode *status) {
    umtx_initOnce(gTimeZoneFilesInitOnce, &TimeZoneDataDirInitFn, *status);
    return U_SUCCESS(*status) ? gTimeZoneFilesDirectory->data() : "";
}